

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O3

void __thiscall
TPZVec<TPZGeoNodeBC_*>::Fill
          (TPZVec<TPZGeoNodeBC_*> *this,TPZGeoNodeBC **copy,int64_t from,int64_t numelem)

{
  long lVar1;
  TPZGeoNodeBC *pTVar2;
  ostream *poVar3;
  long lVar4;
  long lVar5;
  
  if (numelem < -1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"TPZVec::Fill",0xc);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    poVar3 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"It\'s negative parameter numelem, then numelem = ",0x30);
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    std::ostream::flush();
  }
  lVar4 = 0;
  if (0 < from) {
    lVar4 = from;
  }
  lVar1 = this->fNElements;
  if (numelem < 0) {
    numelem = lVar1;
  }
  lVar5 = numelem + from;
  if (lVar1 <= numelem + from) {
    lVar5 = lVar1;
  }
  if (lVar4 < lVar5) {
    pTVar2 = *copy;
    do {
      this->fStore[lVar4] = pTVar2;
      lVar4 = lVar4 + 1;
    } while (lVar5 != lVar4);
  }
  return;
}

Assistant:

void TPZVec<T>::Fill(const T& copy, const int64_t from, const int64_t numelem){
#ifndef PZNODEBUG
	if(numelem<0 && numelem != -1) {
		PZError << "TPZVec::Fill" << std::endl
		<< "It's negative parameter numelem, then numelem = "
		<< fNElements << std::endl;
		
		PZError.flush();
	}
#endif
	
	int64_t first = (from < 0) ? 0 : from;
	int64_t nel = numelem;
	first = (first > fNElements) ? fNElements : first;
	if (nel < 0) nel = fNElements;
	int64_t last = (from+nel > fNElements) ? fNElements : from+nel;
	
	for(int64_t i=first; i<last; i++)
		fStore[i] = copy;
}